

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

bool __thiscall
duckdb::ParquetReader::ScanInternal
          (ParquetReader *this,ClientContext *context,ParquetReaderScanState *state,
          DataChunk *result)

{
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *pMVar1;
  ReadAheadBuffer *this_00;
  set<duckdb::ReadHead_*,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_> *this_01;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_02;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *this_03;
  unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true> *this_04;
  idx_t iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TableFilter *pTVar4;
  TProtocol *pTVar5;
  ThriftFileTransport *pTVar6;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> _Var7;
  MultiFileLocalColumnId params;
  _Base_ptr p_Var8;
  pointer pcVar9;
  byte bVar10;
  int iVar11;
  ParquetRowGroup *pPVar12;
  pointer pCVar13;
  ParquetReader *pPVar14;
  StructColumnReader *pSVar15;
  pointer pDVar16;
  pointer pAVar17;
  reference pvVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  ColumnReader *pCVar22;
  type pTVar23;
  idx_t iVar24;
  undefined4 extraout_var;
  uint64_t len;
  uint64_t uVar25;
  undefined4 extraout_var_00;
  pointer pTVar26;
  _Base_ptr p_Var27;
  InternalException *pIVar28;
  InvalidInputException *this_05;
  IOException *this_06;
  ulong uVar29;
  unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>,_true> *this_07;
  unsigned_long params_1;
  uint uVar30;
  ulong uVar31;
  MultiFileLocalIndex col_idx;
  size_type sVar32;
  _Base_ptr p_Var33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  idx_t filter_count;
  allocator_type local_e1;
  ThriftFileTransport *local_e0;
  SelectionVector *local_d8;
  set<duckdb::ReadHead_*,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_> *local_d0
  ;
  vector<bool,_true> need_to_read;
  string local_90;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  ulong local_68;
  vector<duckdb::ParquetScanFilter,_true> *local_60;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (state->finished == false) {
    if ((state->current_group < 0) ||
       (iVar24 = state->offset_in_group, pPVar12 = GetGroup(this,state),
       pPVar12->num_rows <= (long)iVar24)) {
      state->current_group = state->current_group + 1;
      state->offset_in_group = 0;
      pTVar5 = (state->thrift_file_proto)._M_t.
               super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
               .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>.
               _M_head_impl;
      pTVar6 = (ThriftFileTransport *)
               (pTVar5->ptrans_).
               super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var3 = (pTVar5->ptrans_).
               super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      }
      this_00 = &pTVar6->ra_buffer;
      ::std::__cxx11::_List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>::_M_clear
                ((_List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *)this_00);
      (pTVar6->ra_buffer).read_heads.
      super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)this_00;
      (pTVar6->ra_buffer).read_heads.
      super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)this_00;
      (pTVar6->ra_buffer).read_heads.
      super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node._M_size
           = 0;
      this_01 = &(pTVar6->ra_buffer).merge_set;
      ::std::
      _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
      ::clear(&this_01->_M_t);
      state->current_group_prefetched = false;
      if (state->current_group ==
          (long)(state->group_idx_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state->group_idx_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) goto LAB_01cb47ee;
      this_03 = &state->root_reader;
      local_e0 = pTVar6;
      local_d0 = this_01;
      pCVar13 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                operator->(this_03);
      pPVar14 = ColumnReader::Reader(pCVar13);
      pvVar18 = vector<unsigned_long,_true>::operator[](&state->group_idx_list,state->current_group)
      ;
      iVar24 = GetRowGroupOffset(pPVar14,*pvVar18);
      state->group_offset = iVar24;
      pMVar1 = &(this->super_BaseFileReader).column_ids;
      if ((this->super_BaseFileReader).column_ids.column_ids.
          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          .
          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->super_BaseFileReader).column_ids.column_ids.
          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          .
          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0;
        sVar32 = 0;
        do {
          PrepareRowGroupBuffer(this,state,sVar32);
          pvVar20 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                              (&pMVar1->column_ids,sVar32);
          iVar24 = pvVar20->column_id;
          pCVar13 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                    ::operator->(this_03);
          pSVar15 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar13);
          pCVar22 = StructColumnReader::GetChildReader(pSVar15,iVar24);
          iVar11 = (*pCVar22->_vptr_ColumnReader[8])(pCVar22);
          uVar31 = uVar31 + CONCAT44(extraout_var,iVar11);
          sVar32 = sVar32 + 1;
        } while (sVar32 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        .
                                        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->super_BaseFileReader).column_ids.column_ids.
                                        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        .
                                        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      pPVar12 = GetGroup(this,state);
      if (state->prefetch_mode == false) {
        return true;
      }
      if (state->offset_in_group == pPVar12->num_rows) {
        return true;
      }
      len = GetGroupSpan(this,state);
      if (len < uVar31) {
        this_06 = (IOException *)__cxa_allocate_exception(0x10);
        need_to_read.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &need_to_read.super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&need_to_read,
                   "The parquet file \'%s\' seems to have incorrectly set page offsets. This interferes with DuckDB\'s prefetching optimization. DuckDB may still be able to scan this file by manually disabling the prefetching mechanism using: \'SET disable_parquet_prefetching=true\'."
                   ,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar9 = (this->super_BaseFileReader).file.path._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar9,
                   pcVar9 + (this->super_BaseFileReader).file.path._M_string_length);
        IOException::IOException<std::__cxx11::string>(this_06,(string *)&need_to_read,&local_50);
        __cxa_throw(this_06,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var7._M_head_impl =
           (this->super_BaseFileReader).filters.
           super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
           .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
      if ((_Var7._M_head_impl != (TableFilterSet *)0x0) ||
         (auVar35._8_4_ = (int)(uVar31 >> 0x20), auVar35._0_8_ = uVar31, auVar35._12_4_ = 0x45300000
         , auVar36._8_4_ = (int)(len >> 0x20), auVar36._0_8_ = len, auVar36._12_4_ = 0x45300000,
         ((auVar35._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar31) - 4503599627370496.0)) /
         ((auVar36._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0)) <= 0.95)) {
        if ((this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          this_02 = &(this->super_BaseFileReader).filters;
          uVar31 = 0;
          do {
            pvVar20 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                (&pMVar1->column_ids,uVar31);
            iVar24 = pvVar20->column_id;
            pCVar13 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                      ::operator->(this_03);
            pSVar15 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar13);
            if ((this_02->
                super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
                .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl ==
                (TableFilterSet *)0x0) {
              bVar34 = true;
            }
            else {
              pTVar26 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                        ::operator->(this_02);
              p_Var33 = &(pTVar26->filters)._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var27 = p_Var33;
              for (p_Var8 = (pTVar26->filters)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent; p_Var8 != (_Base_ptr)0x0;
                  p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar31]) {
                if (*(ulong *)(p_Var8 + 1) >= uVar31) {
                  p_Var27 = p_Var8;
                }
              }
              if ((p_Var27 != p_Var33) && (*(ulong *)(p_Var27 + 1) <= uVar31)) {
                p_Var33 = p_Var27;
              }
              pTVar26 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                        ::operator->(this_02);
              bVar34 = (_Rb_tree_header *)p_Var33 ==
                       &(pTVar26->filters)._M_t._M_impl.super__Rb_tree_header;
            }
            pCVar22 = StructColumnReader::GetChildReader(pSVar15,iVar24);
            (*pCVar22->_vptr_ColumnReader[10])
                      (pCVar22,local_e0,
                       (ulong)(byte)(bVar34 ^ 1U | _Var7._M_head_impl == (TableFilterSet *)0x0));
            uVar31 = uVar31 + 1;
          } while (uVar31 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        ::std::
        _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
        ::clear(&local_d0->_M_t);
        if (_Var7._M_head_impl == (TableFilterSet *)0x0) {
          ReadAheadBuffer::Prefetch(this_00);
        }
      }
      else if (state->current_group_prefetched == false) {
        uVar25 = GetGroupCompressedSize(this,state);
        if (uVar25 != 0) {
          iVar24 = GetGroupOffset(this,state);
          ThriftFileTransport::Prefetch(local_e0,iVar24,len);
        }
        state->current_group_prefetched = true;
      }
    }
    else {
      pPVar12 = GetGroup(this,state);
      iVar24 = pPVar12->num_rows;
      iVar2 = state->offset_in_group;
      params_1 = iVar24 - iVar2;
      if (0x7ff < params_1) {
        params_1 = 0x800;
      }
      result->count = params_1;
      if (iVar24 == iVar2) {
LAB_01cb47ee:
        state->finished = true;
        goto LAB_01cb47f4;
      }
      pCVar13 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                operator->(&state->root_reader);
      pPVar14 = ColumnReader::Reader(pCVar13);
      switchD_01306cb1::default
                ((state->define_buf).super_ByteBuffer.ptr,0,(state->define_buf).super_ByteBuffer.len
                );
      switchD_01306cb1::default
                ((state->repeat_buf).super_ByteBuffer.ptr,0,(state->repeat_buf).super_ByteBuffer.len
                );
      local_e0 = (ThriftFileTransport *)(state->define_buf).super_ByteBuffer.ptr;
      local_d0 = (set<duckdb::ReadHead_*,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
                  *)(state->repeat_buf).super_ByteBuffer.ptr;
      pCVar13 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                operator->(&state->root_reader);
      pSVar15 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar13);
      if ((pPVar14->super_BaseFileReader).deletion_filter.
          super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>._M_t.
          super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>
          .super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl == (DeleteFilter *)0x0
          && (this->super_BaseFileReader).filters.
             super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
             .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl ==
             (TableFilterSet *)0x0) {
        if ((this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          sVar32 = 0;
          do {
            pvVar20 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                (&(this->super_BaseFileReader).column_ids.column_ids,sVar32);
            params.column_id = pvVar20->column_id;
            pvVar21 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar32);
            pCVar22 = StructColumnReader::GetChildReader(pSVar15,params.column_id);
            iVar11 = (*pCVar22->_vptr_ColumnReader[3])(pCVar22,params_1,local_e0,local_d0,pvVar21);
            if (CONCAT44(extraout_var_00,iVar11) != params_1) {
              this_05 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              need_to_read.super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
              super__Bit_iterator_base._M_p =
                   (_Bit_type *)
                   &need_to_read.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_finish;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&need_to_read,
                         "Mismatch in parquet read for column %llu, expected %llu rows, got %llu",""
                        );
              InvalidInputException::
              InvalidInputException<duckdb::MultiFileLocalColumnId,unsigned_long,unsigned_long>
                        (this_05,(string *)&need_to_read,params,params_1,
                         CONCAT44(extraout_var_00,iVar11));
              __cxa_throw(this_05,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            sVar32 = sVar32 + 1;
          } while (sVar32 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      else {
        filter_count = result->count;
        local_90._M_dataplus._M_p._0_1_ = 1;
        ::std::vector<bool,_std::allocator<bool>_>::vector
                  (&need_to_read.super_vector<bool,_std::allocator<bool>_>,
                   (long)(this->super_BaseFileReader).column_ids.column_ids.
                         super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         .
                         super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_BaseFileReader).column_ids.column_ids.
                         super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         .
                         super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_90,&local_e1)
        ;
        this_07 = &(pPVar14->super_BaseFileReader).deletion_filter;
        local_d8 = &state->sel;
        p_Var3 = (state->sel).selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (state->sel).selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (state->sel).selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        local_d8->sel_vector = (sel_t *)0x0;
        bVar34 = (this_07->
                 super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>)
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>
                 .super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl ==
                 (DeleteFilter *)0x0;
        uVar30 = (uint)bVar34;
        if (!bVar34) {
          iVar24 = state->offset_in_group;
          iVar2 = state->group_offset;
          pDVar16 = unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>,_true>
                    ::operator->(this_07);
          filter_count = (**(code **)(*(long *)pDVar16 + 0x10))
                                   (pDVar16,iVar2 + iVar24,params_1,local_d8);
        }
        pMVar1 = &(this->super_BaseFileReader).column_ids;
        if ((this->super_BaseFileReader).filters.
            super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
            .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl !=
            (TableFilterSet *)0x0) {
          this_04 = &state->adaptive_filter;
          pAVar17 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                    ::operator->(this_04);
          local_70.__d.__r = (duration)AdaptiveFilter::BeginFilter(pAVar17);
          if (((state->scan_filters).
               super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
               super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               (state->scan_filters).
               super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
               super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
               ._M_impl.super__Vector_impl_data._M_start) && (filter_count != 0)) {
            local_60 = &state->scan_filters;
            uVar31 = 1;
            local_68 = 0x800000000000003f;
            do {
              pAVar17 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                        ::operator->(this_04);
              pvVar18 = vector<unsigned_long,_true>::operator[](&pAVar17->permutation,uVar31 - 1);
              pvVar19 = vector<duckdb::ParquetScanFilter,_true>::operator[](local_60,*pvVar18);
              uVar29 = pvVar19->filter_idx;
              pvVar20 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                  (&pMVar1->column_ids,uVar29);
              iVar24 = pvVar20->column_id;
              local_58 = uVar31;
              pvVar21 = vector<duckdb::Vector,_true>::operator[](&result->data,uVar29);
              pCVar22 = StructColumnReader::GetChildReader(pSVar15,iVar24);
              pTVar4 = pvVar19->filter;
              pTVar23 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                        ::operator*(&pvVar19->filter_state);
              (*pCVar22->_vptr_ColumnReader[5])
                        (pCVar22,params_1,local_e0,local_d0,pvVar21,pTVar4,pTVar23,local_d8,
                         &filter_count,(ulong)uVar30);
              uVar31 = (ulong)need_to_read.super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)need_to_read.super_vector<bool,_std::allocator<bool>_>.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)need_to_read.super_vector<bool,_std::allocator<bool>_>.
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
              if (uVar31 <= uVar29) {
                pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_90,
                           "Attempted to access index %ld within vector of size %ld","");
                InternalException::InternalException<unsigned_long,unsigned_long>
                          (pIVar28,&local_90,uVar29,uVar31);
                __cxa_throw(pIVar28,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              uVar31 = uVar29 + 0x3f;
              if (-1 < (long)uVar29) {
                uVar31 = uVar29;
              }
              bVar10 = (byte)uVar29 & 0x3f;
              need_to_read.super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
              super__Bit_iterator_base._M_p
              [((long)uVar31 >> 6) + ((ulong)((uVar29 & local_68) < 0x8000000000000001) - 1)] =
                   need_to_read.super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p
                   [((long)uVar31 >> 6) + ((ulong)((uVar29 & local_68) < 0x8000000000000001) - 1)] &
                   (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              if ((ulong)(((long)(state->scan_filters).
                                 super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 .
                                 super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(state->scan_filters).
                                 super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 .
                                 super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555) <= local_58) break;
              uVar31 = local_58 + 1;
              uVar30 = 0;
            } while (filter_count != 0);
          }
          pAVar17 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                    ::operator->(this_04);
          AdaptiveFilter::EndFilter(pAVar17,(AdaptiveFilterState)local_70.__d.__r);
        }
        if ((this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar31 = 0;
          do {
            uVar29 = (ulong)need_to_read.super_vector<bool,_std::allocator<bool>_>.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)need_to_read.super_vector<bool,_std::allocator<bool>_>.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)need_to_read.super_vector<bool,_std::allocator<bool>_>.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
            if (uVar29 <= uVar31) {
              pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,
                         "Attempted to access index %ld within vector of size %ld","");
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar28,&local_90,uVar31,uVar29);
              __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            uVar29 = uVar31 + 0x3f;
            if (-1 < (long)uVar31) {
              uVar29 = uVar31;
            }
            if ((need_to_read.super_vector<bool,_std::allocator<bool>_>.
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p
                 [((long)uVar29 >> 6) +
                  ((ulong)((uVar31 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                 (uVar31 & 0x3f) & 1) != 0) {
              pvVar20 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                  (&pMVar1->column_ids,uVar31);
              iVar24 = pvVar20->column_id;
              if (filter_count == 0) {
                pCVar22 = StructColumnReader::GetChildReader(pSVar15,iVar24);
                (*pCVar22->_vptr_ColumnReader[6])(pCVar22,result->count);
              }
              else {
                pvVar21 = vector<duckdb::Vector,_true>::operator[](&result->data,uVar31);
                pCVar22 = StructColumnReader::GetChildReader(pSVar15,iVar24);
                (*pCVar22->_vptr_ColumnReader[4])
                          (pCVar22,result->count,local_e0,local_d0,pvVar21,local_d8,filter_count);
              }
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        if (params_1 != filter_count) {
          DataChunk::Slice(result,local_d8,filter_count);
        }
        if (need_to_read.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(need_to_read.super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
      }
      LOCK();
      (this->rows_read).super___atomic_base<unsigned_long>._M_i =
           (this->rows_read).super___atomic_base<unsigned_long>._M_i + params_1;
      UNLOCK();
      state->offset_in_group = state->offset_in_group + params_1;
    }
    bVar34 = true;
  }
  else {
LAB_01cb47f4:
    bVar34 = false;
  }
  return bVar34;
}

Assistant:

bool ParquetReader::ScanInternal(ClientContext &context, ParquetReaderScanState &state, DataChunk &result) {
	if (state.finished) {
		return false;
	}

	// see if we have to switch to the next row group in the parquet file
	if (state.current_group < 0 || (int64_t)state.offset_in_group >= GetGroup(state).num_rows) {
		state.current_group++;
		state.offset_in_group = 0;

		auto &trans = reinterpret_cast<ThriftFileTransport &>(*state.thrift_file_proto->getTransport());
		trans.ClearPrefetch();
		state.current_group_prefetched = false;

		if ((idx_t)state.current_group == state.group_idx_list.size()) {
			state.finished = true;
			return false;
		}

		// TODO: only need this if we have a deletion vector?
		state.group_offset = GetRowGroupOffset(state.root_reader->Reader(), state.group_idx_list[state.current_group]);

		uint64_t to_scan_compressed_bytes = 0;
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			PrepareRowGroupBuffer(state, col_idx);

			auto file_col_idx = column_ids[col_idx];

			auto &root_reader = state.root_reader->Cast<StructColumnReader>();
			to_scan_compressed_bytes += root_reader.GetChildReader(file_col_idx).TotalCompressedSize();
		}

		auto &group = GetGroup(state);
		if (state.prefetch_mode && state.offset_in_group != (idx_t)group.num_rows) {
			uint64_t total_row_group_span = GetGroupSpan(state);

			double scan_percentage = (double)(to_scan_compressed_bytes) / static_cast<double>(total_row_group_span);

			if (to_scan_compressed_bytes > total_row_group_span) {
				throw IOException(
				    "The parquet file '%s' seems to have incorrectly set page offsets. This interferes with DuckDB's "
				    "prefetching optimization. DuckDB may still be able to scan this file by manually disabling the "
				    "prefetching mechanism using: 'SET disable_parquet_prefetching=true'.",
				    GetFileName());
			}

			if (!filters && scan_percentage > ParquetReaderPrefetchConfig::WHOLE_GROUP_PREFETCH_MINIMUM_SCAN) {
				// Prefetch the whole row group
				if (!state.current_group_prefetched) {
					auto total_compressed_size = GetGroupCompressedSize(state);
					if (total_compressed_size > 0) {
						trans.Prefetch(GetGroupOffset(state), total_row_group_span);
					}
					state.current_group_prefetched = true;
				}
			} else {
				// lazy fetching is when all tuples in a column can be skipped. With lazy fetching the buffer is only
				// fetched on the first read to that buffer.
				bool lazy_fetch = filters != nullptr;

				// Prefetch column-wise
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto col_idx = MultiFileLocalIndex(i);
					auto file_col_idx = column_ids[col_idx];
					auto &root_reader = state.root_reader->Cast<StructColumnReader>();

					bool has_filter = false;
					if (filters) {
						auto entry = filters->filters.find(col_idx);
						has_filter = entry != filters->filters.end();
					}
					root_reader.GetChildReader(file_col_idx).RegisterPrefetch(trans, !(lazy_fetch && !has_filter));
				}

				trans.FinalizeRegistration();

				if (!lazy_fetch) {
					trans.PrefetchRegistered();
				}
			}
		}
		return true;
	}

	auto scan_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, GetGroup(state).num_rows - state.offset_in_group);
	result.SetCardinality(scan_count);

	if (scan_count == 0) {
		state.finished = true;
		return false; // end of last group, we are done
	}

	auto &deletion_filter = state.root_reader->Reader().deletion_filter;

	state.define_buf.zero();
	state.repeat_buf.zero();

	auto define_ptr = (uint8_t *)state.define_buf.ptr;
	auto repeat_ptr = (uint8_t *)state.repeat_buf.ptr;

	auto &root_reader = state.root_reader->Cast<StructColumnReader>();

	if (filters || deletion_filter) {
		idx_t filter_count = result.size();
		D_ASSERT(filter_count == scan_count);
		vector<bool> need_to_read(column_ids.size(), true);

		state.sel.Initialize(nullptr);
		D_ASSERT(!filters || state.scan_filters.size() == filters->filters.size());

		bool is_first_filter = true;
		if (deletion_filter) {
			auto row_start = UnsafeNumericCast<row_t>(state.offset_in_group + state.group_offset);
			filter_count = deletion_filter->Filter(row_start, scan_count, state.sel);
			//! FIXME: does this need to be set?
			//! As part of 'DirectFilter' we also initialize reads of the child readers
			is_first_filter = false;
		}

		if (filters) {
			// first load the columns that are used in filters
			auto filter_state = state.adaptive_filter->BeginFilter();
			for (idx_t i = 0; i < state.scan_filters.size(); i++) {
				if (filter_count == 0) {
					// if no rows are left we can stop checking filters
					break;
				}
				auto &scan_filter = state.scan_filters[state.adaptive_filter->permutation[i]];
				auto local_idx = MultiFileLocalIndex(scan_filter.filter_idx);
				auto column_id = column_ids[local_idx];

				auto &result_vector = result.data[local_idx.GetIndex()];
				auto &child_reader = root_reader.GetChildReader(column_id);
				child_reader.Filter(scan_count, define_ptr, repeat_ptr, result_vector, scan_filter.filter,
				                    *scan_filter.filter_state, state.sel, filter_count, is_first_filter);
				need_to_read[local_idx.GetIndex()] = false;
				is_first_filter = false;
			}
			state.adaptive_filter->EndFilter(filter_state);
		}

		// we still may have to read some cols
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			if (!need_to_read[col_idx]) {
				continue;
			}
			auto file_col_idx = column_ids[col_idx];
			if (filter_count == 0) {
				root_reader.GetChildReader(file_col_idx).Skip(result.size());
				continue;
			}
			auto &result_vector = result.data[i];
			auto &child_reader = root_reader.GetChildReader(file_col_idx);
			child_reader.Select(result.size(), define_ptr, repeat_ptr, result_vector, state.sel, filter_count);
		}
		if (scan_count != filter_count) {
			result.Slice(state.sel, filter_count);
		}
	} else {
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			auto file_col_idx = column_ids[col_idx];
			auto &result_vector = result.data[i];
			auto &child_reader = root_reader.GetChildReader(file_col_idx);
			auto rows_read = child_reader.Read(scan_count, define_ptr, repeat_ptr, result_vector);
			if (rows_read != scan_count) {
				throw InvalidInputException("Mismatch in parquet read for column %llu, expected %llu rows, got %llu",
				                            file_col_idx, scan_count, rows_read);
			}
		}
	}

	rows_read += scan_count;
	state.offset_in_group += scan_count;
	return true;
}